

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O3

bool Assimp::IFC::IntersectsBoundaryProfile
               (IfcVector3 *e0,IfcVector3 *e1,
               vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *boundary,
               bool isStartAssumedInside,
               vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
               *intersect_results,bool halfOpen)

{
  long lVar1;
  pointer paVar2;
  pointer paVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  pointer ppVar7;
  ulong uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  iterator __position;
  pointer ppVar11;
  double *pdVar12;
  unsigned_long uVar13;
  unsigned_long uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  pair<unsigned_long,_aiVector3t<double>_> local_e0;
  vector<std::pair<unsigned_long,aiVector3t<double>>,std::allocator<std::pair<unsigned_long,aiVector3t<double>>>>
  *local_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double dStack_90;
  double local_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  double dStack_40;
  
  ppVar7 = (intersect_results->
           super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (ppVar7 != (intersect_results->
                super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("intersect_results.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCBoolean.cpp"
                  ,0xfb,
                  "bool Assimp::IFC::IntersectsBoundaryProfile(const IfcVector3 &, const IfcVector3 &, const std::vector<IfcVector3> &, const bool, std::vector<std::pair<size_t, IfcVector3>> &, const bool)"
                 );
  }
  paVar2 = (boundary->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  paVar3 = (boundary->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)paVar3 - (long)paVar2 >> 3;
  uVar10 = lVar4 * -0x5555555555555555;
  if (paVar3 == paVar2) {
    local_a8 = -1.0;
  }
  else {
    pdVar12 = &paVar2->y;
    dVar15 = 0.0;
    uVar5 = 1;
    do {
      lVar1 = (lVar4 * 0x5555555555555555 - (ulong)(uVar10 == 0)) + 1 + uVar5;
      uVar6 = uVar5;
      if (uVar10 - uVar5 == 0) {
        uVar6 = 0;
      }
      uVar8 = (uVar5 + 1) % uVar10;
      dVar15 = dVar15 + ((paVar2[uVar8].x - paVar2[uVar6].x) * (paVar2[uVar6].y - *pdVar12) -
                        (paVar2[uVar8].y - paVar2[uVar6].y) *
                        (paVar2[uVar6].x - ((aiVector3t<double> *)(pdVar12 + -1))->x));
      pdVar12 = pdVar12 + 3;
      uVar5 = uVar5 + 1;
    } while (lVar1 != 1);
    local_a8 = *(double *)(&DAT_006c6330 + (ulong)(0.0 < dVar15) * 8);
  }
  uStack_a0 = 0;
  ppVar11 = ppVar7;
  if (paVar3 != paVar2) {
    local_80 = e1->z - e0->z;
    local_98 = e1->x - e0->x;
    dVar15 = e1->y - e0->y;
    local_48 = -local_98;
    dStack_40 = -dVar15;
    lVar4 = 0x10;
    local_58 = (double)((ulong)local_a8 & 0x8000000000000000) * local_80;
    uStack_50 = 0;
    uVar13 = 0;
    local_c0 = (vector<std::pair<unsigned_long,aiVector3t<double>>,std::allocator<std::pair<unsigned_long,aiVector3t<double>>>>
                *)intersect_results;
    local_b8 = dVar15;
    dStack_b0 = dVar15;
    dStack_90 = dVar15;
    do {
      paVar2 = (boundary->
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>)._M_impl
               .super__Vector_impl_data._M_start;
      uVar14 = uVar13 + 1;
      uVar9 = 0;
      if (uVar10 - 1 != uVar13) {
        uVar9 = uVar14;
      }
      dVar23 = *(double *)((long)paVar2 + lVar4 + -0x10);
      dVar29 = *(double *)((long)paVar2 + lVar4 + -8);
      dVar22 = paVar2[uVar9].x - dVar23;
      dVar24 = paVar2[uVar9].y - dVar29;
      dVar16 = local_98 * dVar24 - dVar22 * dVar15;
      if (1e-06 <= ABS(dVar16)) {
        local_68 = e0->x;
        local_78 = e0->y;
        dVar25 = ((dVar23 - local_68) * dVar15 + (dVar29 - local_78) * local_48) / dVar16;
        dVar16 = ((dVar23 - local_68) * dVar24 + (dVar29 - local_78) * -dVar22) / dVar16;
        dVar17 = dVar16 * local_98 + local_68;
        dVar18 = dVar16 * dStack_90 + local_78;
        dVar15 = (dVar22 * dVar25 + dVar23) - dVar17;
        dVar26 = (dVar24 * dVar25 + dVar29) - dVar18;
        dStack_70 = local_78;
        dStack_60 = local_78;
        if (1e-05 <= dVar15 * dVar15 + dVar26 * dVar26) {
          __assert_fail("(IfcVector2(check.x, check.y)).SquareLength() < 1e-5",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCBoolean.cpp"
                        ,0x122,
                        "bool Assimp::IFC::IntersectsBoundaryProfile(const IfcVector3 &, const IfcVector3 &, const std::vector<IfcVector3> &, const bool, std::vector<std::pair<size_t, IfcVector3>> &, const bool)"
                       );
        }
        dVar26 = *(double *)((long)&paVar2->x + lVar4);
        dVar27 = paVar2[uVar9].z - dVar26;
        dVar19 = 1.0 / (dVar27 * dVar27 + dVar22 * dVar22 + dVar24 * dVar24);
        dVar15 = ((e1->x - dVar23) * dVar22 + (e1->y - dVar29) * dVar24) * dVar19;
        if (1.0 <= dVar15) {
          dVar15 = 1.0;
        }
        if (dVar15 <= 0.0) {
          dVar15 = 0.0;
        }
        dVar28 = dVar15 * dVar27 + dVar26;
        dVar21 = (dVar22 * dVar15 + dVar23) - e1->x;
        dVar20 = (dVar24 * dVar15 + dVar29) - e1->y;
        dVar15 = local_b8;
        if (1e-12 <= dVar28 * dVar28 + dVar21 * dVar21 + dVar20 * dVar20 || halfOpen) {
          dVar20 = ((local_68 - dVar23) * dVar22 + (local_78 - dVar29) * dVar24) * dVar19;
          if (1.0 <= dVar20) {
            dVar20 = 1.0;
          }
          if (dVar20 <= 0.0) {
            dVar20 = 0.0;
          }
          dVar26 = dVar26 + dVar27 * dVar20;
          dVar23 = (dVar22 * dVar20 + dVar23) - local_68;
          dVar29 = (dVar20 * dVar24 + dVar29) - local_78;
          if (1e-12 <= dVar26 * dVar26 + dVar23 * dVar23 + dVar29 * dVar29) {
            if ((((dVar19 * -1e-06 <= dVar25) && (dVar25 <= dVar19 * 1e-06 + 1.0)) &&
                (0.0 <= dVar16)) && (dVar16 <= 1.0 || halfOpen)) {
              dVar23 = dVar16 * local_80 + e0->z;
              __position._M_current =
                   *(pair<unsigned_long,_aiVector3t<double>_> **)((long)intersect_results + 8);
              if (((*(pair<unsigned_long,_aiVector3t<double>_> **)intersect_results ==
                    __position._M_current) || (uVar13 - 1 != __position._M_current[-1].first)) ||
                 (dVar29 = __position._M_current[-1].second.x - dVar17,
                 dVar16 = __position._M_current[-1].second.y - dVar18,
                 1e-10 <= dVar29 * dVar29 + dVar16 * dVar16)) goto LAB_005380c2;
            }
          }
          else if ((dVar24 * local_a8 * local_98 + -dVar22 * local_a8 * local_b8 + local_58 <= 0.0
                    == isStartAssumedInside) &&
                  (((__position._M_current =
                          *(pair<unsigned_long,_aiVector3t<double>_> **)
                           ((long)intersect_results + 8),
                    *(pair<unsigned_long,_aiVector3t<double>_> **)intersect_results ==
                    __position._M_current || (uVar13 - 1 != __position._M_current[-1].first)) ||
                   (dVar23 = __position._M_current[-1].second.x - local_68,
                   dVar29 = __position._M_current[-1].second.y - local_78,
                   1e-10 <= dVar23 * dVar23 + dVar29 * dVar29)))) {
            dVar17 = e0->x;
            dVar18 = e0->y;
            dVar23 = e0->z;
LAB_005380c2:
            local_e0.second.z = dVar23;
            local_e0.second.y = dVar18;
            local_e0.second.x = dVar17;
            local_e0.first = uVar13;
            if (__position._M_current ==
                *(pair<unsigned_long,_aiVector3t<double>_> **)((long)intersect_results + 0x10)) {
              std::
              vector<std::pair<unsigned_long,aiVector3t<double>>,std::allocator<std::pair<unsigned_long,aiVector3t<double>>>>
              ::_M_realloc_insert<std::pair<unsigned_long,aiVector3t<double>>>
                        ((vector<std::pair<unsigned_long,aiVector3t<double>>,std::allocator<std::pair<unsigned_long,aiVector3t<double>>>>
                          *)intersect_results,__position,&local_e0);
              intersect_results =
                   (vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                    *)local_c0;
              dVar15 = local_b8;
            }
            else {
              ((__position._M_current)->second).y = local_e0.second.y;
              ((__position._M_current)->second).z = local_e0.second.z;
              (__position._M_current)->first = uVar13;
              ((__position._M_current)->second).x = local_e0.second.x;
              *(long *)((long)intersect_results + 8) = *(long *)((long)intersect_results + 8) + 0x20
              ;
            }
          }
        }
      }
      lVar4 = lVar4 + 0x18;
      uVar13 = uVar14;
    } while (uVar10 + (uVar10 == 0) != uVar14);
    ppVar7 = *(pointer *)intersect_results;
    ppVar11 = *(pointer *)((long)intersect_results + 8);
  }
  return ppVar7 != ppVar11;
}

Assistant:

bool IntersectsBoundaryProfile(const IfcVector3& e0, const IfcVector3& e1, const std::vector<IfcVector3>& boundary,
    const bool isStartAssumedInside, std::vector<std::pair<size_t, IfcVector3> >& intersect_results,
    const bool halfOpen = false)
{
    ai_assert(intersect_results.empty());

    // determine winding order - necessary to detect segments going "inwards" or "outwards" from a point directly on the border
    // positive sum of angles means clockwise order when looking down the -Z axis
    IfcFloat windingOrder = 0.0;
    for( size_t i = 0, bcount = boundary.size(); i < bcount; ++i ) {
        IfcVector3 b01 = boundary[(i + 1) % bcount] - boundary[i];
        IfcVector3 b12 = boundary[(i + 2) % bcount] - boundary[(i + 1) % bcount];
        IfcVector3 b1_side = IfcVector3(b01.y, -b01.x, 0.0); // rotated 90° clockwise in Z plane
        // Warning: rough estimate only. A concave poly with lots of small segments each featuring a small counter rotation
        // could fool the accumulation. Correct implementation would be sum( acos( b01 * b2) * sign( b12 * b1_side))
        windingOrder += (b1_side.x*b12.x + b1_side.y*b12.y);
    }
    windingOrder = windingOrder > 0.0 ? 1.0 : -1.0;

    const IfcVector3 e = e1 - e0;

    for( size_t i = 0, bcount = boundary.size(); i < bcount; ++i ) {
        // boundary segment i: b0-b1
        const IfcVector3& b0 = boundary[i];
        const IfcVector3& b1 = boundary[(i + 1) % bcount];
        IfcVector3 b = b1 - b0;

        // segment-segment intersection
        // solve b0 + b*s = e0 + e*t for (s,t)
        const IfcFloat det = (-b.x * e.y + e.x * b.y);
        if( std::abs(det) < 1e-6 ) {
            // no solutions (parallel lines)
            continue;
        }
        IfcFloat b_sqlen_inv = 1.0 / b.SquareLength();

        const IfcFloat x = b0.x - e0.x;
        const IfcFloat y = b0.y - e0.y;
        const IfcFloat s = (x*e.y - e.x*y) / det; // scale along boundary edge
        const IfcFloat t = (x*b.y - b.x*y) / det; // scale along given segment
        const IfcVector3 p = e0 + e*t;
#ifdef ASSIMP_BUILD_DEBUG
        const IfcVector3 check = b0 + b*s - p;
        ai_assert((IfcVector2(check.x, check.y)).SquareLength() < 1e-5);
#endif

        // also calculate the distance of e0 and e1 to the segment. We need to detect the "starts directly on segment"
        // and "ends directly at segment" cases
        bool startsAtSegment, endsAtSegment;
        {
            // calculate closest point to each end on the segment, clamp that point to the segment's length, then check
            // distance to that point. This approach is like testing if e0 is inside a capped cylinder.
            IfcFloat et0 = (b.x*(e0.x - b0.x) + b.y*(e0.y - b0.y)) * b_sqlen_inv;
            IfcVector3 closestPosToE0OnBoundary = b0 + std::max(IfcFloat(0.0), std::min(IfcFloat(1.0), et0)) * b;
            startsAtSegment = (closestPosToE0OnBoundary - IfcVector3(e0.x, e0.y, 0.0)).SquareLength() < 1e-12;
            IfcFloat et1 = (b.x*(e1.x - b0.x) + b.y*(e1.y - b0.y)) * b_sqlen_inv;
            IfcVector3 closestPosToE1OnBoundary = b0 + std::max(IfcFloat(0.0), std::min(IfcFloat(1.0), et1)) * b;
            endsAtSegment = (closestPosToE1OnBoundary - IfcVector3(e1.x, e1.y, 0.0)).SquareLength() < 1e-12;
        }

        // Line segment ends at boundary -> ignore any hit, it will be handled by possibly following segments
        if( endsAtSegment && !halfOpen )
            continue;

        // Line segment starts at boundary -> generate a hit only if following that line would change the INSIDE/OUTSIDE
        // state. This should catch the case where a connected set of segments has a point directly on the boundary,
        // one segment not hitting it because it ends there and the next segment not hitting it because it starts there
        // Should NOT generate a hit if the segment only touches the boundary but turns around and stays inside.
        if( startsAtSegment )
        {
            IfcVector3 inside_dir = IfcVector3(b.y, -b.x, 0.0) * windingOrder;
            bool isGoingInside = (inside_dir * e) > 0.0;
            if( isGoingInside == isStartAssumedInside )
                continue;

            // only insert the point into the list if it is sufficiently far away from the previous intersection point.
            // This way, we avoid duplicate detection if the intersection is directly on the vertex between two segments.
            if( !intersect_results.empty() && intersect_results.back().first == i - 1 )
            {
                const IfcVector3 diff = intersect_results.back().second - e0;
                if( IfcVector2(diff.x, diff.y).SquareLength() < 1e-10 )
                    continue;
            }
            intersect_results.push_back(std::make_pair(i, e0));
            continue;
        }

        // for a valid intersection, s and t should be in range [0,1]. Including a bit of epsilon on s, potential double
        // hits on two consecutive boundary segments are filtered
        if( s >= -1e-6 * b_sqlen_inv && s <= 1.0 + 1e-6*b_sqlen_inv && t >= 0.0 && (t <= 1.0 || halfOpen) )
        {
            // only insert the point into the list if it is sufficiently far away from the previous intersection point.
            // This way, we avoid duplicate detection if the intersection is directly on the vertex between two segments.
            if( !intersect_results.empty() && intersect_results.back().first == i - 1 )
            {
                const IfcVector3 diff = intersect_results.back().second - p;
                if( IfcVector2(diff.x, diff.y).SquareLength() < 1e-10 )
                    continue;
            }
            intersect_results.push_back(std::make_pair(i, p));
        }
    }

    return !intersect_results.empty();
}